

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

buffer __thiscall
anon_unknown.dwarf_16883::MemoryFile::make_buffer(MemoryFile *this,size_t elements)

{
  void *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer bVar2;
  size_t elements_local;
  
  pvVar1 = operator_new__(elements);
  std::shared_ptr<unsigned_char>::
  shared_ptr<unsigned_char,(anonymous_namespace)::MemoryFile::make_buffer(unsigned_long)::_lambda(unsigned_char*)_1_,void>
            ((shared_ptr<unsigned_char> *)this,pvVar1);
  bVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  bVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (buffer)bVar2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static buffer make_buffer (std::size_t elements) {
            return buffer (new std::uint8_t[elements], [] (std::uint8_t * p) { delete[] p; });
        }